

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O3

int Am_Horizontal_Layout_proc(Am_Object *self)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int primary_spacing;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Am_Value *pAVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  int indent;
  int local_b8;
  int local_b4;
  Am_Alignment v_align;
  Am_Alignment h_align;
  Am_Value_List components;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object component;
  int line_height;
  int line_rank;
  int max_size;
  int max_rank;
  int fixed_height;
  int fixed_width;
  Am_Object item;
  
  Am_Value_List::Am_Value_List(&components);
  pAVar8 = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=(&components,pAVar8);
  component.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&components);
  while( true ) {
    bVar2 = Am_Value_List::Last(&components);
    if (bVar2) break;
    pAVar8 = Am_Value_List::Get(&components);
    Am_Object::operator=(&component,pAVar8);
    pAVar8 = Am_Object::Get(&component,0x69,0);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar8);
    if (!bVar2) {
      Am_Value_List::Delete(&components,true);
    }
    Am_Value_List::Next(&components);
  }
  Am_Object::Am_Object(&local_88,self);
  get_fixed_sizes(&local_88,&components,&fixed_width,&fixed_height);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Am_Object(&local_90,self);
  get_max_rank_and_size(&local_90,&max_rank,&max_size);
  Am_Object::~Am_Object(&local_90);
  pAVar8 = Am_Object::Get(self,0x9e,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x9f,0);
  local_b8 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x95,0);
  primary_spacing = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x96,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x97,0);
  h_align.value = Am_CENTER_ALIGN_val;
  if ((pAVar8->type != 1) && (pAVar8->type != Am_Alignment::Am_Alignment_ID)) {
    Am_Alignment::TypeError(&h_align,pAVar8);
  }
  h_align.value = (Am_Alignment_vals)(pAVar8->value).float_value;
  pAVar8 = Am_Object::Get(self,0x98,0);
  v_align.value = Am_CENTER_ALIGN_val;
  if ((pAVar8->type != 1) && (pAVar8->type != Am_Alignment::Am_Alignment_ID)) {
    Am_Alignment::TypeError(&v_align,pAVar8);
  }
  v_align.value = (Am_Alignment_vals)(pAVar8->value).float_value;
  pAVar8 = Am_Object::Get(self,0x9b,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar8);
  Am_Value_List::Start(&components);
  indent = iVar3;
  do {
    bVar2 = Am_Value_List::Last(&components);
    if (bVar2) {
      Am_Object::~Am_Object(&component);
      Am_Value_List::~Am_Value_List(&components);
      return 0;
    }
    find_line_size_and_rank
              (&components,indent,fixed_width,0x66,primary_spacing,0x67,max_rank,max_size,&line_rank
               ,&line_height);
    iVar1 = line_rank;
    local_b4 = fixed_height;
    if (fixed_height == 0) {
      local_b4 = line_height;
    }
    if (0 < line_rank) {
      iVar11 = 0;
      do {
        item.data = (Am_Object_Data *)0x0;
        pAVar8 = Am_Value_List::Get(&components);
        Am_Object::operator=(&item,pAVar8);
        pAVar8 = Am_Object::Get(&item,0x69,0);
        bVar2 = Am_Value::operator_cast_to_bool(pAVar8);
        if (bVar2) {
          pAVar8 = Am_Object::Get(&item,0x66,0);
          iVar6 = Am_Value::operator_cast_to_int(pAVar8);
          pAVar8 = Am_Object::Get(&item,0x67,0);
          iVar7 = Am_Value::operator_cast_to_int(pAVar8);
          iVar10 = indent;
          if (fixed_width != 0) {
            if (h_align.value == Am_CENTER_ALIGN_val) {
              iVar10 = (fixed_width - iVar6) / 2 + indent;
            }
            else if (h_align.value != Am_LEFT_ALIGN_val) {
              if (h_align.value != Am_RIGHT_ALIGN_val) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Bad alignment value ",0x14);
                poVar9 = operator<<((ostream *)&std::cerr,&h_align);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," in Am_H_ALIGN of ",0x12)
                ;
                goto LAB_001d28d8;
              }
              iVar10 = (indent + fixed_width) - iVar6;
            }
          }
          Am_Object::Set(&item,100,iVar10,0);
          if (v_align.value == Am_CENTER_ALIGN_val) {
            iVar10 = (local_b4 - iVar7) / 2 + local_b8;
          }
          else if (v_align.value == Am_BOTTOM_ALIGN_val) {
            iVar10 = (local_b8 - iVar7) + local_b4;
          }
          else {
            iVar10 = local_b8;
            if (v_align.value != Am_TOP_ALIGN_val) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Bad alignment value ",0x14);
              poVar9 = operator<<((ostream *)&std::cerr,&v_align);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," in Am_V_ALIGN of ",0x12);
LAB_001d28d8:
              poVar9 = operator<<(poVar9,self);
              std::endl<char,std::char_traits<char>>(poVar9);
              Am_Error();
            }
          }
          Am_Object::Set(&item,0x65,iVar10,0);
          if (fixed_width != 0) {
            iVar6 = fixed_width;
          }
          indent = indent + primary_spacing + iVar6;
          iVar11 = iVar11 + 1;
        }
        Am_Value_List::Next(&components);
        Am_Object::~Am_Object(&item);
      } while (iVar11 < iVar1);
    }
    local_b8 = local_b8 + iVar4 + local_b4;
    indent = iVar5 + iVar3;
  } while( true );
}

Assistant:

Am_Define_Formula(int, Am_Horizontal_Layout)
{
  Am_Value_List components;
  components = self.Get(Am_GRAPHICAL_PARTS);
  Am_Object component;
  for (components.Start(); !components.Last(); components.Next()) {
    component = components.Get();
    if (!(bool)component.Get(Am_VISIBLE))
      components.Delete();
  }
  int fixed_width, fixed_height;
  get_fixed_sizes(self, components, fixed_width, fixed_height);
  int max_rank, max_size;
  get_max_rank_and_size(self, max_rank, max_size);
  int left_offset = self.Get(Am_LEFT_OFFSET);
  int left = left_offset;
  int top = self.Get(Am_TOP_OFFSET);
  int h_spacing = self.Get(Am_H_SPACING);
  int v_spacing = self.Get(Am_V_SPACING);
  Am_Alignment h_align = self.Get(Am_H_ALIGN);
  Am_Alignment v_align = self.Get(Am_V_ALIGN);
  int indent = self.Get(Am_INDENT);
  components.Start();
  while (!components.Last()) {
    int line_rank;
    int line_height;
    find_line_size_and_rank(components, left, fixed_width, Am_WIDTH, h_spacing,
                            Am_HEIGHT, max_rank, max_size, line_rank,
                            line_height);
    int rank = 0;
    while (rank < line_rank) {
      Am_Object item;
      item = components.Get();
      if ((bool)item.Get(Am_VISIBLE)) {
        int width = item.Get(Am_WIDTH);
        int height = item.Get(Am_HEIGHT);
        if (fixed_width) {
          switch (h_align.value) {
          case Am_LEFT_ALIGN_val:
            item.Set(Am_LEFT, left);
            break;
          case Am_RIGHT_ALIGN_val:
            item.Set(Am_LEFT, left + fixed_width - width);
            break;
          case Am_CENTER_ALIGN_val:
            item.Set(Am_LEFT, left + (fixed_width - width) / 2);
            break;
          default:
            Am_ERRORO("Bad alignment value " << h_align << " in Am_H_ALIGN of "
                                             << self,
                      self, Am_H_ALIGN);
          }
        } else
          item.Set(Am_LEFT, left);
        switch (v_align.value) {
        case Am_TOP_ALIGN_val:
          item.Set(Am_TOP, top);
          break;
        case Am_BOTTOM_ALIGN_val:
          item.Set(Am_TOP,
                   top + (fixed_height ? fixed_height : line_height) - height);
          break;
        case Am_CENTER_ALIGN_val:
          item.Set(
              Am_TOP,
              top + ((fixed_height ? fixed_height : line_height) - height) / 2);
          break;
        default:
          Am_ERRORO("Bad alignment value " << v_align << " in Am_V_ALIGN of "
                                           << self,
                    self, Am_V_ALIGN);
        }
        left += (fixed_width ? fixed_width : width) + h_spacing;
        ++rank;
      }
      components.Next();
    }
    top += (fixed_height ? fixed_height : line_height) + v_spacing;
    left = left_offset + indent;
  }
  return 0;
}